

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall UniValue::pushKV(UniValue *this,string *key,UniValue *val_)

{
  VType VVar1;
  bool bVar2;
  size_t in_RAX;
  size_t idx;
  size_t local_28;
  
  VVar1 = this->typ;
  if (VVar1 == VOBJ) {
    local_28 = in_RAX;
    bVar2 = findKey(this,key,&local_28);
    if (bVar2) {
      operator=((this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start + local_28,val_);
    }
    else {
      __pushKV(this,key,val_);
    }
  }
  return VVar1 == VOBJ;
}

Assistant:

bool UniValue::pushKV(const std::string& key, const UniValue& val_)
{
    if (typ != VOBJ)
        return false;

    size_t idx;
    if (findKey(key, idx))
        values[idx] = val_;
    else
        __pushKV(key, val_);
    return true;
}